

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgStatement.cpp
# Opt level: O2

void __thiscall
rsg::DeclarationStatement::execute(DeclarationStatement *this,ExecutionContext *execCtx)

{
  int iVar1;
  undefined4 extraout_var;
  ConstStridedValueAccess<64> local_38;
  StridedValueRead<64> local_28;
  
  if (this->m_expression != (Expression *)0x0) {
    (*this->m_expression->_vptr_Expression[4])();
    iVar1 = (*this->m_expression->_vptr_Expression[5])();
    local_28.m_type = (VariableType *)CONCAT44(extraout_var,iVar1);
    local_38 = (ConstStridedValueAccess<64>)ExecutionContext::getValue(execCtx,this->m_variable);
    StridedValueAccess<64>::operator=((StridedValueAccess<64> *)&local_38,&local_28);
  }
  return;
}

Assistant:

void DeclarationStatement::execute (ExecutionContext& execCtx) const
{
	if (m_expression)
	{
		m_expression->evaluate(execCtx);
		execCtx.getValue(m_variable) = m_expression->getValue().value();
	}
}